

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.hpp
# Opt level: O2

int __thiscall actorpp::detail::ChannelImpl<int>::pop(ChannelImpl<int> *this)

{
  int iVar1;
  int *piVar2;
  logic_error *this_00;
  unique_lock<std::mutex> lock;
  
  std::unique_lock<std::mutex>::unique_lock
            (&lock,&((this->actor_impl).
                     super___shared_ptr<actorpp::detail::ActorImpl,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->mut);
  piVar2 = (this->elements).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  if ((this->elements).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
      ._M_finish._M_cur != piVar2) {
    iVar1 = *piVar2;
    std::deque<int,_std::allocator<int>_>::pop_front(&(this->elements).c);
    std::unique_lock<std::mutex>::~unique_lock(&lock);
    return iVar1;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"called pop() on unreadable channel");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

T pop() {
    std::unique_lock<std::mutex> lock(actor_impl->mut);
    if (!readable_with_lock())
      throw std::logic_error("called pop() on unreadable channel");
    T element = std::move(elements.front());
    elements.pop();
    return element;
  }